

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

void collect_args_and_func_types(c2m_ctx_t c2m_ctx,func_type *func_type)

{
  gen_ctx_conflict *pgVar1;
  int iVar2;
  node_t_conflict pnVar3;
  target_arg_info_t local_60;
  target_arg_info_t arg_info;
  char *name;
  decl_t param_decl;
  type *param_type;
  node_t_conflict p;
  node_t_conflict first_param;
  node_t_conflict id;
  node_t_conflict declarator;
  gen_ctx_t_conflict gen_ctx;
  func_type *func_type_local;
  c2m_ctx_t c2m_ctx_local;
  
  pgVar1 = c2m_ctx->gen_ctx;
  param_type = (type *)DLIST_node_t_head(&(func_type->param_list->u).ops);
  VARR_MIR_var_ttrunc((pgVar1->proto_info).arg_vars,0);
  VARR_MIR_type_ttrunc((pgVar1->proto_info).ret_types,0);
  (pgVar1->proto_info).res_ref_p = 0;
  target_init_arg_vars(c2m_ctx,&local_60);
  set_type_layout(c2m_ctx,func_type->ret_type);
  target_add_res_proto
            (c2m_ctx,func_type->ret_type,&local_60,(pgVar1->proto_info).ret_types,
             (pgVar1->proto_info).arg_vars);
  if ((param_type != (type *)0x0) && (iVar2 = void_param_p((node_t_conflict)param_type), iVar2 == 0)
     ) {
    for (; param_type != (type *)0x0;
        param_type = (type *)DLIST_node_t_next((node_t_conflict)param_type)) {
      if (*(int *)&param_type->pos_node == 0x7b) {
        arg_info = (target_arg_info_t)((long)"mir.ui2d.p" + 9);
        param_decl = *(decl_t *)&param_type->arr_type->mode;
      }
      else {
        pnVar3 = DLIST_node_t_el((DLIST_node_t *)&param_type->align,1);
        if (((*(int *)&param_type->pos_node != 0x55) || (pnVar3 == (node_t_conflict)0x0)) ||
           (pnVar3->code != N_DECL)) {
          __assert_fail("p->code == N_SPEC_DECL && declarator != NULL && declarator->code == N_DECL"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                        ,0x2c94,"void collect_args_and_func_types(c2m_ctx_t, struct func_type *)");
        }
        pnVar3 = DLIST_node_t_head(&(pnVar3->u).ops);
        param_decl = (decl_t)param_type->arr_type[1].arr_type;
        arg_info = (target_arg_info_t)get_param_name(c2m_ctx,(type *)param_decl,(pnVar3->u).s.s);
      }
      target_add_arg_proto
                (c2m_ctx,(char *)arg_info,(type *)param_decl,&local_60,(pgVar1->proto_info).arg_vars
                );
    }
  }
  return;
}

Assistant:

static void collect_args_and_func_types (c2m_ctx_t c2m_ctx, struct func_type *func_type) {
  gen_ctx_t gen_ctx = c2m_ctx->gen_ctx;
  node_t declarator, id, first_param, p;
  struct type *param_type;
  decl_t param_decl;
  const char *name;
  target_arg_info_t arg_info;

  first_param = NL_HEAD (func_type->param_list->u.ops);
  VARR_TRUNC (MIR_var_t, proto_info.arg_vars, 0);
  VARR_TRUNC (MIR_type_t, proto_info.ret_types, 0);
  proto_info.res_ref_p = FALSE;
  target_init_arg_vars (c2m_ctx, &arg_info);
  set_type_layout (c2m_ctx, func_type->ret_type);
  target_add_res_proto (c2m_ctx, func_type->ret_type, &arg_info, proto_info.ret_types,
                        proto_info.arg_vars);
  if (first_param != NULL && !void_param_p (first_param)) {
    for (p = first_param; p != NULL; p = NL_NEXT (p)) {
      if (p->code == N_TYPE) {
        name = "p";
        param_type = ((struct decl_spec *) p->attr)->type;
        param_decl = NULL;
      } else {
        declarator = NL_EL (p->u.ops, 1);
        assert (p->code == N_SPEC_DECL && declarator != NULL && declarator->code == N_DECL);
        id = NL_HEAD (declarator->u.ops);
        param_decl = p->attr;
        param_type = param_decl->decl_spec.type;
        name = get_param_name (c2m_ctx, param_type, id->u.s.s);
      }
      target_add_arg_proto (c2m_ctx, name, param_type, &arg_info, proto_info.arg_vars);
    }
  }
}